

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O3

void mz_zip_reader_sort_central_dir_offsets_by_filename(mz_zip_archive *pZip)

{
  byte *pbVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  uint *puVar6;
  long lVar7;
  long lVar8;
  byte bVar9;
  ushort uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  byte *pbVar14;
  ulong uVar15;
  byte bVar16;
  long *in_RSI;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  mz_uint32 t;
  long lVar22;
  byte *pbVar23;
  bool bVar24;
  
  uVar18 = (uint)pZip;
  if (1 < uVar18) {
    uVar21 = (ulong)pZip & 0xffffffff;
    uVar12 = (ulong)(uVar18 - 2 >> 1);
    puVar6 = (uint *)in_RSI[8];
    do {
      uVar11 = uVar12 * 2 + 1;
      if (uVar11 < uVar21) {
        lVar7 = *in_RSI;
        lVar8 = in_RSI[4];
        uVar19 = uVar12;
        do {
          if (uVar19 * 2 + 2 < uVar21) {
            uVar15 = (ulong)*(uint *)(lVar8 + (ulong)puVar6[uVar11] * 4);
            uVar13 = (ulong)*(uint *)(lVar8 + (ulong)puVar6[uVar19 * 2 + 2] * 4);
            pbVar14 = (byte *)(lVar7 + 0x2e + uVar15);
            uVar3 = *(ushort *)(lVar7 + 0x1c + uVar13);
            uVar4 = *(ushort *)(pbVar14 + -0x12);
            uVar10 = uVar3;
            if (uVar4 < uVar3) {
              uVar10 = uVar4;
            }
            pbVar1 = (byte *)((ulong)uVar10 + 0x2e + lVar7 + uVar15);
            if (uVar10 == 0) {
              bVar9 = 0;
              bVar16 = 0;
            }
            else {
              pbVar23 = (byte *)(uVar13 + lVar7 + 0x2e);
              do {
                bVar16 = *pbVar14;
                bVar9 = bVar16 + 0x20;
                if (0x19 < (byte)(bVar16 + 0xbf)) {
                  bVar9 = bVar16;
                }
                bVar2 = *pbVar23;
                bVar16 = bVar2 + 0x20;
                if (0x19 < (byte)(bVar2 + 0xbf)) {
                  bVar16 = bVar2;
                }
                if (bVar9 != bVar16) break;
                pbVar14 = pbVar14 + 1;
                pbVar23 = pbVar23 + 1;
                bVar16 = bVar9;
              } while (pbVar14 < pbVar1);
            }
            bVar24 = bVar9 < bVar16;
            if (pbVar14 == pbVar1) {
              bVar24 = uVar4 < uVar3;
            }
            uVar15 = (ulong)bVar24;
          }
          else {
            uVar15 = 0;
          }
          uVar15 = uVar15 + uVar11;
          uVar5 = puVar6[uVar19];
          uVar13 = (ulong)*(uint *)(lVar8 + (ulong)uVar5 * 4);
          uVar11 = (ulong)*(uint *)(lVar8 + (ulong)puVar6[uVar15] * 4);
          pbVar14 = (byte *)(lVar7 + 0x2e + uVar13);
          uVar3 = *(ushort *)(lVar7 + 0x1c + uVar11);
          uVar4 = *(ushort *)(pbVar14 + -0x12);
          uVar10 = uVar3;
          if (uVar4 < uVar3) {
            uVar10 = uVar4;
          }
          pbVar1 = (byte *)((ulong)uVar10 + 0x2e + lVar7 + uVar13);
          if (uVar10 == 0) {
            bVar9 = 0;
            bVar16 = 0;
          }
          else {
            pbVar23 = (byte *)(uVar11 + lVar7 + 0x2e);
            do {
              bVar16 = *pbVar14;
              bVar2 = *pbVar23;
              bVar9 = bVar16 + 0x20;
              if (0x19 < (byte)(bVar16 + 0xbf)) {
                bVar9 = bVar16;
              }
              bVar16 = bVar2 + 0x20;
              if (0x19 < (byte)(bVar2 + 0xbf)) {
                bVar16 = bVar2;
              }
              if (bVar9 != bVar16) break;
              pbVar14 = pbVar14 + 1;
              pbVar23 = pbVar23 + 1;
              bVar16 = bVar9;
            } while (pbVar14 < pbVar1);
          }
          bVar24 = bVar16 <= bVar9;
          if (pbVar14 == pbVar1) {
            bVar24 = uVar3 <= uVar4;
          }
          if (bVar24) break;
          puVar6[uVar19] = puVar6[uVar15];
          puVar6[uVar15] = uVar5;
          uVar11 = uVar15 * 2 + 1;
          uVar19 = uVar15;
        } while (uVar11 < uVar21);
      }
      bVar24 = uVar12 != 0;
      uVar12 = uVar12 - 1;
    } while (bVar24);
    uVar12 = (ulong)(uVar18 - 1);
    do {
      uVar18 = puVar6[uVar12];
      puVar6[uVar12] = *puVar6;
      *puVar6 = uVar18;
      if (1 < uVar12) {
        uVar21 = 1;
        lVar17 = 0;
        lVar7 = *in_RSI;
        lVar8 = in_RSI[4];
        lVar20 = 0;
        do {
          if (lVar17 + 2U < uVar12) {
            uVar19 = (ulong)*(uint *)(lVar8 + (ulong)puVar6[uVar21] * 4);
            uVar11 = (ulong)*(uint *)(lVar8 + (ulong)puVar6[lVar17 + 2] * 4);
            pbVar14 = (byte *)(lVar7 + 0x2e + uVar19);
            uVar3 = *(ushort *)(lVar7 + 0x1c + uVar11);
            uVar4 = *(ushort *)(pbVar14 + -0x12);
            uVar10 = uVar3;
            if (uVar4 < uVar3) {
              uVar10 = uVar4;
            }
            pbVar1 = (byte *)((ulong)uVar10 + 0x2e + lVar7 + uVar19);
            if (uVar10 == 0) {
              bVar16 = 0;
              bVar9 = 0;
            }
            else {
              pbVar23 = (byte *)(uVar11 + lVar7 + 0x2e);
              do {
                bVar9 = *pbVar14;
                bVar2 = *pbVar23;
                bVar16 = bVar9 + 0x20;
                if (0x19 < (byte)(bVar9 + 0xbf)) {
                  bVar16 = bVar9;
                }
                bVar9 = bVar2 + 0x20;
                if (0x19 < (byte)(bVar2 + 0xbf)) {
                  bVar9 = bVar2;
                }
                if (bVar16 != bVar9) break;
                pbVar14 = pbVar14 + 1;
                pbVar23 = pbVar23 + 1;
                bVar9 = bVar16;
              } while (pbVar14 < pbVar1);
            }
            bVar24 = bVar16 < bVar9;
            if (pbVar14 == pbVar1) {
              bVar24 = uVar4 < uVar3;
            }
            uVar11 = (ulong)bVar24;
          }
          else {
            uVar11 = 0;
          }
          lVar22 = uVar11 + uVar21;
          uVar11 = (ulong)*(uint *)(lVar8 + (ulong)uVar18 * 4);
          uVar21 = (ulong)*(uint *)(lVar8 + (ulong)puVar6[lVar22] * 4);
          pbVar14 = (byte *)(lVar7 + 0x2e + uVar11);
          uVar3 = *(ushort *)(lVar7 + 0x1c + uVar21);
          uVar4 = *(ushort *)(pbVar14 + -0x12);
          uVar10 = uVar3;
          if (uVar4 < uVar3) {
            uVar10 = uVar4;
          }
          pbVar1 = (byte *)((ulong)uVar10 + 0x2e + lVar7 + uVar11);
          if (uVar10 == 0) {
            bVar16 = 0;
            bVar9 = 0;
          }
          else {
            pbVar23 = (byte *)(uVar21 + lVar7 + 0x2e);
            do {
              bVar9 = *pbVar14;
              bVar2 = *pbVar23;
              bVar16 = bVar9 + 0x20;
              if (0x19 < (byte)(bVar9 + 0xbf)) {
                bVar16 = bVar9;
              }
              bVar9 = bVar2 + 0x20;
              if (0x19 < (byte)(bVar2 + 0xbf)) {
                bVar9 = bVar2;
              }
              if (bVar16 != bVar9) break;
              pbVar14 = pbVar14 + 1;
              pbVar23 = pbVar23 + 1;
              bVar9 = bVar16;
            } while (pbVar14 < pbVar1);
          }
          bVar24 = bVar9 <= bVar16;
          if (pbVar14 == pbVar1) {
            bVar24 = uVar3 <= uVar4;
          }
          if (bVar24) break;
          puVar6[lVar20] = puVar6[lVar22];
          uVar21 = lVar22 * 2 + 1;
          lVar17 = lVar22 * 2;
          puVar6[lVar22] = uVar18;
          lVar20 = lVar22;
        } while (uVar21 < uVar12);
      }
      uVar12 = uVar12 - 1;
    } while ((int)uVar12 != 0);
  }
  return;
}

Assistant:

static void mz_zip_reader_sort_central_dir_offsets_by_filename(mz_zip_archive* pZip) {

    mz_zip_internal_state* pState = pZip->m_pState;
    const mz_zip_array* pCentral_dir_offsets = &pState->m_central_dir_offsets;
    const mz_zip_array* pCentral_dir = &pState->m_central_dir;
    mz_uint32* pIndices;
    mz_uint32 start, end;
    const mz_uint32 size = pZip->m_total_files;

    if (size <= 1U)
        return;

    pIndices = &MZ_ZIP_ARRAY_ELEMENT(&pState->m_sorted_central_dir_offsets, mz_uint32, 0);

    start = (size - 2U) >> 1U;
    for (;;) {
        mz_uint64 child, root = start;
        for (;;) {
            if ((child = (root << 1U) + 1U) >= size)
                break;
            child += (((child + 1U) < size) && (mz_zip_reader_filename_less(pCentral_dir,
                                                                            pCentral_dir_offsets,
                                                                            pIndices[child],
                                                                            pIndices[child + 1U])));
            if (!mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets, pIndices[root], pIndices[child]))
                break;
            MZ_SWAP_UINT32(pIndices[root], pIndices[child]);
            root = child;
        }
        if (!start)
            break;
        start--;
    }

    end = size - 1;
    while (end > 0) {
        mz_uint64 child, root = 0;
        MZ_SWAP_UINT32(pIndices[end], pIndices[0]);
        for (;;) {
            if ((child = (root << 1U) + 1U) >= end)
                break;
            child += (((child + 1U) < end) && mz_zip_reader_filename_less(pCentral_dir,
                                                                          pCentral_dir_offsets,
                                                                          pIndices[child],
                                                                          pIndices[child + 1U]));
            if (!mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets, pIndices[root], pIndices[child]))
                break;
            MZ_SWAP_UINT32(pIndices[root], pIndices[child]);
            root = child;
        }
        end--;
    }
}